

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O0

PAL_ERROR CorUnix::InternalOpenFileMapping
                    (CPalThread *pThread,DWORD dwDesiredAccess,BOOL bInheritHandle,LPCWSTR lpName,
                    HANDLE *phMapping)

{
  BOOL BVar1;
  undefined1 local_48 [8];
  CPalString sObjectName;
  IPalObject *pFileMapping;
  PAL_ERROR palError;
  HANDLE *phMapping_local;
  LPCWSTR lpName_local;
  BOOL bInheritHandle_local;
  DWORD dwDesiredAccess_local;
  CPalThread *pThread_local;
  
  sObjectName.m_dwStringLength = 0;
  sObjectName.m_dwMaxLength = 0;
  CPalString::CPalString((CPalString *)local_48,lpName);
  BVar1 = MAPContainsInvalidFlags(dwDesiredAccess);
  if (BVar1 == 0) {
    pFileMapping._4_4_ =
         (**(code **)(*g_pObjectManager + 0x10))
                   (g_pObjectManager,pThread,local_48,&aotFileMapping,&sObjectName.m_dwStringLength)
    ;
    if (pFileMapping._4_4_ == 0) {
      pFileMapping._4_4_ =
           (**(code **)(*g_pObjectManager + 0x18))
                     (g_pObjectManager,pThread,sObjectName._8_8_,dwDesiredAccess,bInheritHandle != 0
                      ,0,phMapping);
    }
  }
  else {
    fprintf(_stderr,"] %s %s:%d","InternalOpenFileMapping",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/map/map.cpp"
            ,0x367);
    fprintf(_stderr,
            "dwDesiredAccess can be one or more of FILE_MAP_READ, FILE_MAP_WRITE, FILE_MAP_COPY or FILE_MAP_ALL_ACCESS.\n"
           );
    pFileMapping._4_4_ = 0x57;
  }
  if (sObjectName._8_8_ != 0) {
    (**(code **)(*(long *)sObjectName._8_8_ + 0x40))(sObjectName._8_8_,pThread);
  }
  return pFileMapping._4_4_;
}

Assistant:

PAL_ERROR
CorUnix::InternalOpenFileMapping(
    CPalThread *pThread,
    DWORD dwDesiredAccess,
    BOOL bInheritHandle,
    LPCWSTR lpName,
    HANDLE *phMapping
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pFileMapping = NULL;
    CPalString sObjectName(lpName);

    if ( MAPContainsInvalidFlags( dwDesiredAccess ) ) 
    {
        ASSERT( "dwDesiredAccess can be one or more of FILE_MAP_READ, " 
               "FILE_MAP_WRITE, FILE_MAP_COPY or FILE_MAP_ALL_ACCESS.\n" );
        palError = ERROR_INVALID_PARAMETER;
        goto ExitInternalOpenFileMapping;
    }

    palError = g_pObjectManager->LocateObject(
        pThread,
        &sObjectName,
        &aotFileMapping, 
        &pFileMapping
        );

    if (NO_ERROR != palError)
    {
        goto ExitInternalOpenFileMapping;
    }

    palError = g_pObjectManager->ObtainHandleForObject(
        pThread,
        pFileMapping,
        dwDesiredAccess,
        bInheritHandle,
        NULL,
        phMapping
        );

    if (NO_ERROR != palError)
    {
        goto ExitInternalOpenFileMapping;
    }

ExitInternalOpenFileMapping:

    if (NULL != pFileMapping)
    {
        pFileMapping->ReleaseReference(pThread);
    }
    
    return palError;
}